

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

GLFWcursor * glfwCreateCursor(GLFWimage *image,int xhot,int yhot)

{
  GLFWbool GVar1;
  _GLFWcursor *cursor;
  int yhot_local;
  int xhot_local;
  GLFWimage *image_local;
  
  if (image == (GLFWimage *)0x0) {
    __assert_fail("image != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                  ,0x343,"GLFWcursor *glfwCreateCursor(const GLFWimage *, int, int)");
  }
  if (image->pixels == (uchar *)0x0) {
    __assert_fail("image->pixels != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                  ,0x344,"GLFWcursor *glfwCreateCursor(const GLFWimage *, int, int)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    image_local = (GLFWimage *)0x0;
  }
  else if ((image->width < 1) || (image->height < 1)) {
    _glfwInputError(0x10004,"Invalid image dimensions for cursor");
    image_local = (GLFWimage *)0x0;
  }
  else {
    image_local = (GLFWimage *)_glfw_calloc(1,0x10);
    *(_GLFWcursor **)image_local = _glfw.cursorListHead;
    _glfw.cursorListHead = (_GLFWcursor *)image_local;
    GVar1 = (*_glfw.platform.createCursor)((_GLFWcursor *)image_local,image,xhot,yhot);
    if (GVar1 == 0) {
      glfwDestroyCursor((GLFWcursor *)image_local);
      image_local = (GLFWimage *)0x0;
    }
  }
  return (GLFWcursor *)image_local;
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateCursor(const GLFWimage* image, int xhot, int yhot)
{
    _GLFWcursor* cursor;

    assert(image != NULL);
    assert(image->pixels != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (image->width <= 0 || image->height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid image dimensions for cursor");
        return NULL;
    }

    cursor = _glfw_calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfw.platform.createCursor(cursor, image, xhot, yhot))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}